

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# music_softsynth_mididevice.cpp
# Opt level: O0

int __thiscall SoftSynthMIDIDevice::StreamOut(SoftSynthMIDIDevice *this,MIDIHDR *header)

{
  MIDIHDR **local_20;
  MIDIHDR **p;
  MIDIHDR *header_local;
  SoftSynthMIDIDevice *this_local;
  
  header->lpNext = (MIDIHDR *)0x0;
  if (this->Events == (MIDIHDR *)0x0) {
    this->Events = header;
    this->NextTickIn = this->SamplesPerTick * (double)*(uint *)header->lpData;
    this->Position = 0;
  }
  else {
    for (local_20 = &this->Events; *local_20 != (MIDIHDR *)0x0; local_20 = &(*local_20)->lpNext) {
    }
    *local_20 = header;
  }
  return 0;
}

Assistant:

int SoftSynthMIDIDevice::StreamOut(MIDIHDR *header)
{
	header->lpNext = NULL;
	if (Events == NULL)
	{
		Events = header;
		NextTickIn = SamplesPerTick * *(DWORD *)header->lpData;
		Position = 0;
	}
	else
	{
		MIDIHDR **p;

		for (p = &Events; *p != NULL; p = &(*p)->lpNext)
		{ }
		*p = header;
	}
	return 0;
}